

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

char * read_digit(Lexer *lexer,CharBuff *buff)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  
  uVar2 = read_chr(lexer);
  if (uVar2 != 0xc9) {
    bVar1 = false;
    do {
      if (uVar2 - 0x3a < 0xfffffff6) {
        if ((uVar2 != 0x2e) || (bVar1)) {
          lexer->last_chr = uVar2;
          break;
        }
        uVar2 = read_chr(lexer);
        if (uVar2 - 0x30 < 10) {
          append_chr(buff,'.');
          append_chr(buff,(char)uVar2);
        }
        else {
          lexer->last_chr = uVar2;
        }
        bVar1 = true;
        if (9 < uVar2 - 0x30) break;
      }
      else {
        append_chr(buff,(char)uVar2);
      }
      uVar2 = read_chr(lexer);
    } while (uVar2 != 0xc9);
  }
  pcVar3 = to_string(buff);
  return pcVar3;
}

Assistant:

char *read_digit(Lexer *lexer, CharBuff* buff) {
    uint chr;
    bool dot = false;
    while ((chr = read_chr(lexer)) != END) {
        if (is_digit(chr)) {
            append_chr(buff, (char) chr);
        } else if (chr == '.' && !dot) {
            dot = true;
            int pre_chr = chr;
            chr = read_chr(lexer);
            if (is_digit(chr)) {
                append_chr(buff, (char) pre_chr);
                append_chr(buff, (char) chr);
                dot = true;
            } else {
                unread_chr(lexer, chr);
                break;
            }
        } else {
            unread_chr(lexer, chr);
            break;
        }
    }
    return to_string(buff);
}